

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  void *a;
  FILE *__s;
  uint8_t *__ptr;
  uint64_t __size;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  char *__format;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  bool bVar13;
  bool bVar14;
  uint32_t nr_of_triangles;
  uint32_t nr_of_vertices;
  int local_494;
  int local_490;
  int local_48c;
  uint32_t *triangles;
  float *vertices;
  int local_474;
  int local_470;
  int local_46c;
  uint16_t *attributes;
  float *texcoords;
  uint32_t *vertex_colors;
  float *vertex_normals;
  float *triangle_normals;
  undefined8 local_440;
  char new_filename [1024];
  
  if (argc < 3) {
    puts("Usage: trico_encoder -i <input> [options]\n");
    puts("Options:");
    puts("  -i <input>           input file name of type binary stl or binary/ascii ply.");
    puts("  -o <output>          output file name.");
    puts("  -stladd <attribute>  add a given stl attribute (normal, uint16).");
    puts("  -plyskip <attribute> skip a given ply attribute (normal, tex_coord, color).");
    putchar(10);
    return -1;
  }
  local_494 = argc + -1;
  local_440 = 0;
  local_470 = 0;
  local_474 = 0;
  local_46c = 0;
  local_48c = 0;
  local_490 = 0;
  pcVar7 = (char *)0x0;
  for (iVar12 = 1; iVar12 < argc; iVar12 = iVar12 + 2) {
    pcVar5 = argv[iVar12];
    if (*pcVar5 == '-') {
      if ((pcVar5[1] == 'i') && (pcVar5[2] == '\0')) {
        if (iVar12 == local_494) {
          pcVar7 = "I expect a filename after command -i";
          goto LAB_00102a76;
        }
        pcVar7 = argv[(long)iVar12 + 1];
      }
      else {
        if ((pcVar5[1] != 'o') || (pcVar5[2] != '\0')) goto LAB_001023f2;
        if (iVar12 == local_494) {
          pcVar7 = "I expect a filename after command -o";
          goto LAB_00102a76;
        }
        pcVar5 = argv[(long)iVar12 + 1];
        for (uVar4 = 0; pcVar5[uVar4] != '\0'; uVar4 = uVar4 + 1) {
          new_filename[uVar4] = pcVar5[uVar4];
        }
        new_filename[uVar4 & 0xffffffff] = '\0';
        local_440 = 1;
      }
    }
    else {
LAB_001023f2:
      iVar3 = strcmp(pcVar5,"-stladd");
      if (iVar3 == 0) {
        if (iVar12 == local_494) {
          pcVar7 = "I expect an attribute after command -stladd";
          goto LAB_00102a76;
        }
        pcVar5 = argv[(long)iVar12 + 1];
        iVar3 = strcmp(pcVar5,"normal");
        if (iVar3 == 0) {
          local_470 = 1;
        }
        else {
          iVar3 = strcmp(pcVar5,"tex_coord");
          if (iVar3 != 0) {
            iVar3 = strcmp(pcVar5,"color");
            local_46c = 1;
            goto LAB_001024a9;
          }
          local_474 = 1;
        }
      }
      else {
        iVar3 = strcmp(pcVar5,"-plyskip");
        if (iVar3 != 0) {
          __format = "Unknown command %s\n";
          pcVar7 = pcVar5;
          goto LAB_0010257b;
        }
        if (iVar12 == local_494) {
          pcVar7 = "I expect an attribute after command -plyskip";
          goto LAB_00102a76;
        }
        pcVar5 = argv[(long)iVar12 + 1];
        iVar3 = strcmp(pcVar5,"normal");
        if (iVar3 == 0) {
          local_490 = 1;
        }
        else {
          iVar3 = strcmp(pcVar5,"uint16");
          local_48c = 1;
LAB_001024a9:
          if (iVar3 != 0) {
            __format = "Unknown attribute %s\n";
            pcVar7 = pcVar5;
            goto LAB_0010257b;
          }
        }
      }
    }
  }
  if (pcVar7 == (char *)0x0) {
    pcVar7 = "An input file name is required";
  }
  else {
    if ((int)local_440 == 0) {
      lVar6 = 0;
      for (uVar4 = 0; uVar1 = uVar4, pcVar7[uVar4] != '\0'; uVar4 = uVar4 + 1) {
        new_filename[uVar4] = pcVar7[uVar4];
        lVar6 = lVar6 + -0x100000000;
      }
      do {
        lVar8 = lVar6;
        if (uVar1 - 1 == 0) break;
        lVar9 = uVar1 - 1;
        lVar6 = lVar8 + 0x100000000;
        uVar1 = uVar1 - 1;
      } while (new_filename[lVar9] != '.');
      if (new_filename[-0x100000000 - lVar8 >> 0x20] == '.') {
        lVar6 = -lVar8 >> 0x20;
        pcVar5 = new_filename + lVar6 + 3;
        (new_filename + lVar6)[0] = 't';
        (new_filename + lVar6)[1] = 'r';
        new_filename[lVar6 + 2] = 'c';
      }
      else {
        pcVar5 = new_filename + (uVar4 & 0xffffffff) + 4;
        builtin_strncpy(new_filename + (uVar4 & 0xffffffff),".trc",4);
      }
      *pcVar5 = '\0';
    }
    lVar8 = 0x100000000;
    for (lVar6 = 0; pcVar7[lVar6] != '\0'; lVar6 = lVar6 + 1) {
      lVar8 = lVar8 + 0x100000000;
    }
    lVar9 = 1;
    lVar11 = lVar6;
    do {
      if (lVar11 == 1) {
        lVar10 = 0;
        goto LAB_0010263a;
      }
      lVar8 = lVar8 + -0x100000000;
      lVar10 = lVar11 + -1;
      lVar2 = lVar11 + -1;
      lVar11 = lVar10;
    } while (pcVar7[lVar2] != '.');
    lVar9 = lVar8 >> 0x20;
LAB_0010263a:
    bVar13 = false;
    if ((pcVar7[(int)lVar10] == '.') && (bVar13 = false, (int)lVar10 + 4 == (int)lVar6)) {
      if (((byte)(pcVar7[lVar9] | 0x20U) == 0x73) && ((byte)(pcVar7[lVar9 + 1] | 0x20U) == 0x74)) {
        bVar13 = (pcVar7[lVar9 + 2] + 0xb4U & 0xdf) == 0;
      }
      else {
        bVar13 = false;
      }
    }
    lVar8 = 0x100000000;
    for (lVar6 = 0; pcVar7[lVar6] != '\0'; lVar6 = lVar6 + 1) {
      lVar8 = lVar8 + 0x100000000;
    }
    lVar9 = 1;
    bVar14 = false;
    lVar11 = lVar6;
    do {
      if (lVar11 == 1) {
        lVar10 = 0;
        goto LAB_001026b9;
      }
      lVar8 = lVar8 + -0x100000000;
      lVar10 = lVar11 + -1;
      lVar2 = lVar11 + -1;
      lVar11 = lVar10;
    } while (pcVar7[lVar2] != '.');
    lVar9 = lVar8 >> 0x20;
LAB_001026b9:
    if ((((pcVar7[(int)lVar10] == '.') && ((int)lVar10 + 4 == (int)lVar6)) &&
        ((byte)(pcVar7[lVar9] | 0x20U) == 0x70)) && ((byte)(pcVar7[lVar9 + 1] | 0x20U) == 0x6c)) {
      bVar14 = (pcVar7[lVar9 + 2] + 0xa7U & 0xdf) == 0;
    }
    if (!bVar14 && !bVar13) {
      pcVar7 = "I expect the input file to be of type stl or ply.";
      goto LAB_00102a76;
    }
    nr_of_vertices = 0;
    vertices = (float *)0x0;
    triangle_normals = (float *)0x0;
    vertex_normals = (float *)0x0;
    vertex_colors = (uint32_t *)0x0;
    nr_of_triangles = 0;
    triangles = (uint32_t *)0x0;
    texcoords = (float *)0x0;
    attributes = (uint16_t *)0x0;
    if (bVar13) {
      if (local_490 == 0 && local_48c == 0) {
        iVar12 = trico_read_stl(&nr_of_vertices,&vertices,&nr_of_triangles,&triangles,pcVar7);
      }
      else {
        iVar12 = trico_read_stl_full(&nr_of_vertices,&vertices,&nr_of_triangles,&triangles,
                                     &triangle_normals,&attributes,pcVar7);
      }
      if (iVar12 != 1) {
        __format = "Not a valid stl file: %s\n";
        goto LAB_0010257b;
      }
    }
    if ((bVar14) &&
       (iVar12 = trico_read_ply(&nr_of_vertices,&vertices,&vertex_normals,&vertex_colors,
                                &nr_of_triangles,&triangles,&texcoords,pcVar7), iVar12 != 1)) {
      __format = "Not a valid ply file: %s\n";
LAB_0010257b:
      printf(__format,pcVar7);
      return -1;
    }
    a = trico_open_archive_for_writing(0x100000);
    if ((vertices == (float *)0x0 || nr_of_vertices == 0) ||
       (iVar12 = trico_write_vertices(a,vertices,nr_of_vertices), iVar12 != 0)) {
      if ((triangles == (uint32_t *)0x0 || nr_of_triangles == 0) ||
         (iVar12 = trico_write_triangles(a,triangles,nr_of_triangles), iVar12 != 0)) {
        if (((bool)(local_490 != 0 & bVar13)) &&
           ((triangle_normals != (float *)0x0 && nr_of_triangles != 0 &&
            (iVar12 = trico_write_triangle_normals(a,triangle_normals,nr_of_triangles), iVar12 == 0)
            ))) {
          pcVar7 = "Something went wrong when writing the triangle normals";
        }
        else if (((bool)(bVar13 & local_48c != 0)) &&
                ((attributes != (uint16_t *)0x0 && nr_of_triangles != 0 &&
                 (iVar12 = trico_write_attributes_uint16(a,attributes,nr_of_triangles), iVar12 == 0)
                 ))) {
          pcVar7 = "Something went wrong when writing the uint16 attributes";
        }
        else if ((local_470 == 0 && bVar14) &&
                ((vertex_normals != (float *)0x0 && nr_of_vertices != 0 &&
                 (iVar12 = trico_write_vertex_normals(a,vertex_normals,nr_of_vertices), iVar12 == 0)
                 ))) {
          pcVar7 = "Something went wrong when writing the vertex normals";
        }
        else if ((local_46c == 0 && bVar14) &&
                ((vertex_colors != (uint32_t *)0x0 && nr_of_vertices != 0 &&
                 (iVar12 = trico_write_vertex_colors(a,vertex_colors,nr_of_vertices), iVar12 == 0)))
                ) {
          pcVar7 = "Something went wrong when writing the vertex colors";
        }
        else {
          if ((local_474 != 0 || !bVar14) ||
             ((texcoords == (float *)0x0 || nr_of_triangles == 0 ||
              (iVar12 = trico_write_uv_per_triangle(a,texcoords,nr_of_triangles), iVar12 != 0)))) {
            free(vertices);
            free(vertex_normals);
            free(vertex_colors);
            free(triangles);
            free(texcoords);
            free(triangle_normals);
            free(attributes);
            __s = fopen(new_filename,"wb");
            if (__s != (FILE *)0x0) {
              __ptr = trico_get_buffer_pointer(a);
              __size = trico_get_size(a);
              fwrite(__ptr,__size,1,__s);
              fclose(__s);
              trico_close_archive(a);
              return 0;
            }
            __format = "Cannot write to file %s\n";
            pcVar7 = new_filename;
            goto LAB_0010257b;
          }
          pcVar7 = "Something went wrong when writing the texture coordinates";
        }
      }
      else {
        pcVar7 = "Something went wrong when writing the triangles";
      }
    }
    else {
      pcVar7 = "Something went wrong when writing the vertices";
    }
  }
LAB_00102a76:
  puts(pcVar7);
  return -1;
}

Assistant:

int main(int argc, const char** argv)
  {
  if (argc < 3)
    {
    print_help();
    return -1;
    }
  const char* filename = NULL;
  char new_filename[1024];
  int include_stl_normals = 0;
  int include_stl_uint16 = 0;
  int output_filename = 0;
  int skip_ply_normals = 0;
  int skip_ply_texcoords = 0;
  int skip_ply_color = 0;

  for (int j = 1; j < argc; ++j)
    {
    if (strcmp(argv[j], "-i") == 0)
      {
      if (j == argc - 1)
        {
        printf("I expect a filename after command -i\n");
        return -1;
        }
      ++j;
      filename = argv[j];
      }
    else if (strcmp(argv[j], "-o") == 0)
      {
      if (j == argc - 1)
        {
        printf("I expect a filename after command -o\n");
        return -1;
        }
      ++j;
      const char* ptr = argv[j];
      int idx = 0;
      while (*ptr)
        new_filename[idx++] = *ptr++;
      new_filename[idx] = 0;
      output_filename = 1;
      }      
    else if (strcmp(argv[j], "-stladd") == 0)
      {
      if (j == argc - 1)
        {
        printf("I expect an attribute after command -stladd\n");
        return -1;
        }
      ++j;
      if (strcmp(argv[j], "normal") == 0)
        {
        skip_ply_normals = 1;
        }
      else if (strcmp(argv[j], "tex_coord") == 0)
        {
        skip_ply_texcoords = 1;
        }
      else if (strcmp(argv[j], "color") == 0)
        {
        skip_ply_color = 1;
        }
      else
        {
        printf("Unknown attribute %s\n", argv[j]);
        return -1;
        }
      }
    else if (strcmp(argv[j], "-plyskip") == 0)
      {
      if (j == argc - 1)
        {
        printf("I expect an attribute after command -plyskip\n");
        return -1;
        }
      ++j;
      if (strcmp(argv[j], "normal") == 0)
        {
        include_stl_normals = 1;
        }
      else if (strcmp(argv[j], "uint16") == 0)
        {
        include_stl_uint16 = 1;
        }
      else
        {
        printf("Unknown attribute %s\n", argv[j]);
        return -1;
        }
      }
    else
      {
      printf("Unknown command %s\n", argv[j]);
      return -1;
      }
    }

  if (!filename)
    {
    printf("An input file name is required\n");
    return -1;
    }

  if (!output_filename)
    {
    change_extension_to_trc(new_filename, filename);
    }

  int is_stl = extension_is_stl(filename);
  int is_ply = extension_is_ply(filename);

  if (!is_stl && !is_ply)
    {
    printf("I expect the input file to be of type stl or ply.\n");
    return -1;
    }

  uint32_t nr_of_vertices = 0;
  float* vertices = NULL;
  float* triangle_normals = NULL;
  float* vertex_normals = NULL;
  uint32_t* vertex_colors = NULL;
  uint32_t nr_of_triangles = 0;
  uint32_t* triangles = NULL;
  float* texcoords = NULL;
  uint16_t* attributes = NULL;

  int read_successfully = 0;

  if (is_stl)
    {
    if (include_stl_normals || include_stl_uint16)
      read_successfully = trico_read_stl_full(&nr_of_vertices, &vertices, &nr_of_triangles, &triangles, &triangle_normals, &attributes, filename);
    else
      read_successfully = trico_read_stl(&nr_of_vertices, &vertices, &nr_of_triangles, &triangles, filename);
    if (read_successfully != 1)
      {
      printf("Not a valid stl file: %s\n", filename);
      return -1;
      }
    }
  if (is_ply)
    {
    read_successfully = trico_read_ply(&nr_of_vertices, &vertices, &vertex_normals, &vertex_colors, &nr_of_triangles, &triangles, &texcoords, filename);
    if (read_successfully != 1)
      {
      printf("Not a valid ply file: %s\n", filename);
      return -1;
      }
    }  

  void* arch = trico_open_archive_for_writing(1024 * 1024);
  if (nr_of_vertices && vertices && !trico_write_vertices(arch, vertices, nr_of_vertices))
    {
    printf("Something went wrong when writing the vertices\n");
    return -1;
    }
  if (nr_of_triangles && triangles && !trico_write_triangles(arch, triangles, nr_of_triangles))
    {
    printf("Something went wrong when writing the triangles\n");
    return -1;
    }
  if (is_stl && include_stl_normals)
    {
    if (nr_of_triangles && triangle_normals && !trico_write_triangle_normals(arch, triangle_normals, nr_of_triangles))
      {
      printf("Something went wrong when writing the triangle normals\n");
      return -1;
      }
    }
  if (is_stl && include_stl_uint16)
    {
    if (nr_of_triangles && attributes && !trico_write_attributes_uint16(arch, attributes, nr_of_triangles))
      {
      printf("Something went wrong when writing the uint16 attributes\n");
      return -1;
      }
    }
  if (is_ply && !skip_ply_normals)
    {
    if (nr_of_vertices && vertex_normals && !trico_write_vertex_normals(arch, vertex_normals, nr_of_vertices))
      {
      printf("Something went wrong when writing the vertex normals\n");
      return -1;
      }      
    }
  if (is_ply && !skip_ply_color)
    {
    if (nr_of_vertices && vertex_colors && !trico_write_vertex_colors(arch, vertex_colors, nr_of_vertices))
      {
      printf("Something went wrong when writing the vertex colors\n");
      return -1;
      }
    }
  if (is_ply && !skip_ply_texcoords)
    {
    if (nr_of_triangles && texcoords && !trico_write_uv_per_triangle(arch, texcoords, nr_of_triangles))
      {
      printf("Something went wrong when writing the texture coordinates\n");
      return -1;
      }
    }

  trico_free(vertices);
  trico_free(vertex_normals);
  trico_free(vertex_colors);
  trico_free(triangles);
  trico_free(texcoords);
  trico_free(triangle_normals);
  trico_free(attributes);

  FILE* f = fopen(new_filename, "wb");
  if (!f)
    {
    printf("Cannot write to file %s\n", new_filename);
    return -1;
    }

  fwrite((const void*)trico_get_buffer_pointer(arch), trico_get_size(arch), 1, f);
  fclose(f);

  trico_close_archive(arch);

  return 0;
  }